

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

bool __thiscall
GEO::Delaunay2d::create_first_triangle(Delaunay2d *this,index_t *iv0,index_t *iv1,index_t *iv2)

{
  char cVar1;
  index_t iVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  uint uVar6;
  Sign SVar7;
  index_t iVar8;
  index_t iVar9;
  pointer piVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint __tmp;
  long lVar14;
  index_t t [3];
  index_t aiStack_44 [3];
  double *local_38;
  
  if (2 < (this->super_Delaunay).nb_vertices_) {
    *iv0 = 0;
    *iv1 = 1;
    uVar6 = (this->super_Delaunay).nb_vertices_;
    uVar12 = 1;
    if (1 < uVar6) {
      pdVar5 = (this->super_Delaunay).vertices_;
      uVar11 = (this->super_Delaunay).vertex_stride_;
      uVar13 = *iv0 * uVar11;
      while( true ) {
        if ((((pdVar5[uVar13] != pdVar5[uVar11]) || (NAN(pdVar5[uVar13]) || NAN(pdVar5[uVar11]))) ||
            (pdVar5[(ulong)uVar13 + 1] != pdVar5[(ulong)uVar11 + 1])) ||
           (NAN(pdVar5[(ulong)uVar13 + 1]) || NAN(pdVar5[(ulong)uVar11 + 1]))) break;
        uVar12 = uVar12 + 1;
        *iv1 = uVar12;
        uVar6 = (this->super_Delaunay).nb_vertices_;
        if (uVar6 <= uVar12) break;
        iVar9 = (this->super_Delaunay).vertex_stride_;
        uVar13 = *iv0 * iVar9;
        uVar11 = iVar9 * uVar12;
      }
    }
    if (uVar12 != uVar6) {
      local_38 = (this->super_Delaunay).vertices_;
      do {
        uVar11 = uVar12;
        uVar12 = uVar11 + 1;
        *iv2 = uVar12;
        uVar6 = (this->super_Delaunay).nb_vertices_;
        if (uVar6 <= uVar12) {
          uVar13 = uVar11 + 1;
          if (uVar13 == uVar6) {
            return false;
          }
          goto LAB_001505a8;
        }
        iVar9 = (this->super_Delaunay).vertex_stride_;
        uVar13 = *iv1;
        SVar7 = PCK::orient_2d(local_38 + *iv0 * iVar9,local_38 + uVar13 * iVar9,
                               local_38 + iVar9 * uVar12);
      } while (SVar7 == ZERO);
      if (SVar7 == NEGATIVE) {
        *iv1 = uVar12;
        *iv2 = uVar13;
      }
      else {
        uVar13 = uVar11 + 1;
      }
LAB_001505a8:
      iVar9 = *iv0;
      iVar2 = *iv1;
      iVar8 = new_triangle(this);
      uVar6 = iVar8 * 3;
      piVar10 = (this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
                .super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar10[uVar6] = iVar9;
      piVar10[(ulong)iVar8 * 3 + 1 & 0xffffffff] = iVar2;
      piVar10[iVar8 * 3 + 2] = uVar13;
      lVar14 = 0;
      do {
        iVar3 = piVar10[(int)(char)(&DAT_001ab8d6)[lVar14 * 2] + uVar6];
        iVar4 = piVar10[(int)(char)(&triangle_edge_vertex_)[lVar14 * 2] + uVar6];
        iVar9 = new_triangle(this);
        piVar10 = (this->cell_to_v_store_).
                  super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                  super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar10[iVar9 * 3] = -1;
        piVar10[iVar9 * 3 + 1] = iVar3;
        piVar10[iVar9 * 3 + 2] = iVar4;
        aiStack_44[lVar14] = iVar9;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      piVar10 = (this->cell_to_cell_store_).
                super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar14 = 0;
      do {
        iVar9 = aiStack_44[lVar14];
        piVar10[iVar9 * 3] = iVar8;
        piVar10[uVar6 + (int)lVar14] = iVar9;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      lVar14 = 0;
      do {
        cVar1 = (&triangle_edge_vertex_)[lVar14 * 2];
        iVar9 = aiStack_44[lVar14];
        piVar10[iVar9 * 3 + 1] = aiStack_44[(uint)(int)(char)(&DAT_001ab8d6)[lVar14 * 2]];
        piVar10[iVar9 * 3 + 2] = aiStack_44[(long)cVar1 & 0xffffffff];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      return true;
    }
  }
  return false;
}

Assistant:

bool Delaunay2d::create_first_triangle(
        index_t& iv0, index_t& iv1, index_t& iv2
    ) {
        if(nb_vertices() < 3) {
            return false;
        }

        iv0 = 0;

        iv1 = 1;
        while(
            iv1 < nb_vertices() &&
            PCK::points_are_identical_2d(
                vertex_ptr(iv0), vertex_ptr(iv1)
            )
        ) {
            ++iv1;
        }
        if(iv1 == nb_vertices()) {
            return false;
        }

        iv2 = iv1 + 1;
	Sign s = ZERO;
        while(
            iv2 < nb_vertices() &&  
	    (s = PCK::orient_2d(vertex_ptr(iv0), vertex_ptr(iv1), vertex_ptr(iv2))) == ZERO
	) {
            ++iv2;
        }
        if(iv2 == nb_vertices()) {
            return false;
        }
	if(s == NEGATIVE) {
	    std::swap(iv1,iv2);
	}
	    
        // Create the first triangle
        index_t t0 = new_triangle(
            signed_index_t(iv0), 
            signed_index_t(iv1), 
            signed_index_t(iv2)
        );

        // Create the first three virtual triangles surrounding it
        index_t t[3];
        for(index_t e = 0; e < 3; ++e) {
            // In reverse order since it is an adjacent tetrahedron
            signed_index_t v1 = triangle_vertex(t0, triangle_edge_vertex(e,1));
            signed_index_t v2 = triangle_vertex(t0, triangle_edge_vertex(e,0));
            t[e] = new_triangle(VERTEX_AT_INFINITY, v1, v2);
        }

        // Connect the virtual triangles to the real one
        for(index_t e=0; e<3; ++e) {
            set_triangle_adjacent(t[e], 0, t0);
            set_triangle_adjacent(t0, e, t[e]);
        }

        // Interconnect the three virtual triangles along their common
        // edges
        for(index_t e = 0; e < 3; ++e) {
            // In reverse order since it is an adjacent tetrahedron
            index_t lv1 = triangle_edge_vertex(e,1);
            index_t lv2 = triangle_edge_vertex(e,0);
            set_triangle_adjacent(t[e], 1, t[lv1]);
            set_triangle_adjacent(t[e], 2, t[lv2]);
        }

        return true;
    }